

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GetMemberOfVectorOfStruct
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr,
          ImportMap *imports)

{
  size_t t;
  pair<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  _Base_ptr local_1c8;
  undefined1 local_1c0;
  _Base_ptr local_1b8;
  undefined1 local_1b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string return_type;
  string local_e8;
  undefined1 local_c8 [8];
  ImportMapEntry import_entry;
  string local_78;
  undefined1 local_58 [8];
  Type vectortype;
  string *code;
  ImportMap *imports_local;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  vectortype._24_8_ = code_ptr;
  Type::VectorType((Type *)local_58,&(field->value).type);
  GenReceiver(this,struct_def,code_ptr);
  Namer::Method<flatbuffers::FieldDef>(&local_78,&(this->namer_).super_Namer,field);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  GenPackageReference_abi_cxx11_(&local_e8,this,&(field->value).type);
  TypeName_abi_cxx11_((string *)((long)&return_type.field_2 + 8),this,field);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_c8,&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&return_type.field_2 + 8));
  std::__cxx11::string::~string((string *)(return_type.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_e8);
  if (((((this->super_BaseGenerator).parser_)->opts).python_typing & 1U) == 0) {
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,"(self, j)");
  }
  else {
    ReturnType_abi_cxx11_((string *)local_128,this,struct_def,field);
    std::operator+(&local_168,"(self, j: int) -> Optional[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    std::operator+(&local_148,&local_168,"]");
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[7],_const_char_(&)[9],_true>
              (&local_1a8,(char (*) [7])0x42fa07,(char (*) [9])"Optional");
    pVar1 = std::
            set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::insert(imports,&local_1a8);
    local_1b8 = (_Base_ptr)pVar1.first._M_node;
    local_1b0 = pVar1.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_1a8);
    pVar1 = std::
            set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::insert(imports,(value_type *)local_c8);
    local_1c8 = (_Base_ptr)pVar1.first._M_node;
    local_1c0 = pVar1.second;
    std::__cxx11::string::~string((string *)local_128);
  }
  OffsetPrefix_abi_cxx11_(&local_208,this,field,true);
  std::operator+(&local_1e8,":",&local_208);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::operator+(&local_268,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_248,&local_268,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_228,&local_248,"x = self._tab.Vector(o)\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::operator+(&local_2a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_288,&local_2a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::operator+=
            ((string *)vectortype._24_8_,"x += flatbuffers.number_types.UOffsetTFlags.py_type(j) * "
            );
  t = InlineSize((Type *)local_58);
  NumToString<unsigned_long>(&local_2e8,t);
  std::operator+(&local_2c8,&local_2e8,"\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  if ((*(byte *)(vectortype._0_8_ + 0x110) & 1) == 0) {
    std::operator+(&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::Indent_abi_cxx11_);
    std::operator+(&local_328,&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::Indent_abi_cxx11_);
    std::operator+(&local_308,&local_328,"x = self._tab.Indirect(x)\n");
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
  }
  if ((((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers & 1U) != 0) &&
     (((((this->super_BaseGenerator).parser_)->opts).python_typing & 1U) == 0)) {
    std::operator+(&local_388,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::Indent_abi_cxx11_);
    std::operator+(&local_368,&local_388,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::Indent_abi_cxx11_);
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::operator+(&local_408,"from ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
    std::operator+(&local_3e8,&local_408," import ");
    std::operator+(&local_3c8,&local_3e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&import_entry.first.field_2 + 8));
    std::operator+(&local_3a8,&local_3c8,"\n");
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
  }
  std::operator+(&local_4a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_488,&local_4a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_468,&local_488,"obj = ");
  TypeName_abi_cxx11_(&local_4c8,this,field);
  std::operator+(&local_448,&local_468,&local_4c8);
  std::operator+(&local_428,&local_448,"()\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::operator+(&local_528,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_508,&local_528,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_4e8,&local_508,"obj.Init(self._tab.Bytes, x)\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::operator+(&local_588,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_568,&local_588,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_548,&local_568,"return obj\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_548);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_588);
  std::operator+(&local_5c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_5a8,&local_5c8,"return None\n\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_c8);
  return;
}

Assistant:

void GetMemberOfVectorOfStruct(const StructDef &struct_def,
                                 const FieldDef &field, std::string *code_ptr,
                                 ImportMap &imports) const {
    auto &code = *code_ptr;
    auto vectortype = field.value.type.VectorType();

    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field);
    const ImportMapEntry import_entry = {
      GenPackageReference(field.value.type), TypeName(field)
    };

    if (parser_.opts.python_typing) {
      const std::string return_type = ReturnType(struct_def, field);
      code += "(self, j: int) -> Optional[" + return_type + "]";
      imports.insert(ImportMapEntry{ "typing", "Optional" });
      imports.insert(import_entry);
    } else {
      code += "(self, j)";
    }
    code += ":" + OffsetPrefix(field);
    code += Indent + Indent + Indent + "x = self._tab.Vector(o)\n";
    code += Indent + Indent + Indent;
    code += "x += flatbuffers.number_types.UOffsetTFlags.py_type(j) * ";
    code += NumToString(InlineSize(vectortype)) + "\n";
    if (!(vectortype.struct_def->fixed)) {
      code += Indent + Indent + Indent + "x = self._tab.Indirect(x)\n";
    }
    if (parser_.opts.include_dependence_headers &&
        !parser_.opts.python_typing) {
      code += Indent + Indent + Indent;
      code += "from " + import_entry.first + " import " + import_entry.second +
              "\n";
    }
    code += Indent + Indent + Indent + "obj = " + TypeName(field) + "()\n";
    code += Indent + Indent + Indent + "obj.Init(self._tab.Bytes, x)\n";
    code += Indent + Indent + Indent + "return obj\n";
    code += Indent + Indent + "return None\n\n";
  }